

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O2

void plutovg_path_traverse
               (plutovg_path_t *path,plutovg_path_traverse_func_t traverse_func,void *closure)

{
  plutovg_path_command_t pVar1;
  int iVar2;
  plutovg_path_iterator_t it;
  plutovg_point_t points [3];
  
  it.elements = (path->elements).data;
  it.size = (path->elements).size;
  it.index = 0;
switchD_0010e8c0_default:
  if (it.size <= it.index) {
    return;
  }
  pVar1 = plutovg_path_iterator_next(&it,points);
  switch(pVar1) {
  case PLUTOVG_PATH_COMMAND_MOVE_TO:
    pVar1 = PLUTOVG_PATH_COMMAND_MOVE_TO;
    break;
  case PLUTOVG_PATH_COMMAND_LINE_TO:
    pVar1 = PLUTOVG_PATH_COMMAND_LINE_TO;
    break;
  case PLUTOVG_PATH_COMMAND_CUBIC_TO:
    pVar1 = PLUTOVG_PATH_COMMAND_CUBIC_TO;
    iVar2 = 3;
    goto LAB_0010e8e9;
  case PLUTOVG_PATH_COMMAND_CLOSE:
    pVar1 = PLUTOVG_PATH_COMMAND_CLOSE;
    break;
  default:
    goto switchD_0010e8c0_default;
  }
  iVar2 = 1;
LAB_0010e8e9:
  (*traverse_func)(closure,pVar1,points,iVar2);
  goto switchD_0010e8c0_default;
}

Assistant:

void plutovg_path_traverse(const plutovg_path_t* path, plutovg_path_traverse_func_t traverse_func, void* closure)
{
    plutovg_path_iterator_t it;
    plutovg_path_iterator_init(&it, path);

    plutovg_point_t points[3];
    while(plutovg_path_iterator_has_next(&it)) {
        switch(plutovg_path_iterator_next(&it, points)) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
            traverse_func(closure, PLUTOVG_PATH_COMMAND_MOVE_TO, points, 1);
            break;
        case PLUTOVG_PATH_COMMAND_LINE_TO:
            traverse_func(closure, PLUTOVG_PATH_COMMAND_LINE_TO, points, 1);
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            traverse_func(closure, PLUTOVG_PATH_COMMAND_CUBIC_TO, points, 3);
            break;
        case PLUTOVG_PATH_COMMAND_CLOSE:
            traverse_func(closure, PLUTOVG_PATH_COMMAND_CLOSE, points, 1);
            break;
        }
    }
}